

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::EnumDescriptorProto::SharedDtor(EnumDescriptorProto *this)

{
  string *default_value;
  EnumDescriptorProto *pEVar1;
  EnumDescriptorProto *this_local;
  
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::DestroyNoArena(&this->name_,default_value);
  pEVar1 = internal_default_instance();
  if ((this != pEVar1) && (this->options_ != (EnumOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void EnumDescriptorProto::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete options_;
  }
}